

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *in_RDI;
  bool bVar4;
  CRef unaff_retaddr;
  Var unaff_retaddr_00;
  SimpSolver *in_stack_00000008;
  int i;
  vec<unsigned_int> *cls;
  bool in_stack_00000057;
  SimpSolver *in_stack_00000058;
  Solver *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  lbool b;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int local_28;
  lbool local_22;
  uint8_t local_21;
  vec<unsigned_int> *local_20;
  bool local_1;
  
  b.value = (uint8_t)((uint)in_stack_ffffffffffffffc4 >> 0x18);
  local_20 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::lookup
                       ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
                         *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI);
  local_21 = (uint8_t)Solver::value(in_stack_ffffffffffffffb8,0);
  lbool::lbool(&local_22,'\x02');
  bVar1 = lbool::operator!=((lbool *)in_stack_ffffffffffffffb8,b);
  bVar4 = true;
  if (!bVar1) {
    iVar2 = vec<unsigned_int>::size(local_20);
    bVar4 = iVar2 == 0;
  }
  if (bVar4) {
    local_1 = true;
  }
  else {
    local_28 = 0;
    while (iVar2 = local_28, iVar3 = vec<unsigned_int>::size(local_20), iVar2 < iVar3) {
      vec<unsigned_int>::operator[](local_20,local_28);
      bVar1 = asymm(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
      if (!bVar1) {
        return false;
      }
      local_28 = local_28 + 1;
    }
    local_1 = backwardSubsumptionCheck(in_stack_00000058,in_stack_00000057);
  }
  return local_1;
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef> &cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0) return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i])) return false;

    return backwardSubsumptionCheck();
}